

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O3

void duckdb::ListHasAllFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong *puVar5;
  data_ptr_t pdVar6;
  __buckets_ptr pp_Var7;
  sel_t *psVar8;
  data_ptr_t pdVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar10;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  SelectionVector *pSVar13;
  bool bVar14;
  int iVar15;
  BoundFunctionExpression *pBVar16;
  reference vec;
  reference vec_00;
  LogicalType *pLVar17;
  idx_t iVar18;
  idx_t iVar19;
  Vector *this_00;
  Vector *this_01;
  iterator iVar20;
  idx_t iVar21;
  TemplatedValidityData<unsigned_long> *pTVar22;
  _Head_base<0UL,_unsigned_long_*,_false> _Var23;
  idx_t iVar24;
  uint64_t idx_3;
  ulong uVar25;
  ValidityMask *this_02;
  data_t dVar26;
  uint64_t idx;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  uint64_t idx_2;
  ulong uVar31;
  ulong uVar32;
  uint64_t idx_1;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  UnifiedVectorFormat probe_format;
  UnifiedVectorFormat build_format;
  UnifiedVectorFormat ldata;
  string_set_t set;
  Vector r_sortkey_vec;
  Vector l_sortkey_vec;
  ulong local_2d8;
  ulong local_2d0;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2a0;
  UnifiedVectorFormat local_290;
  UnifiedVectorFormat local_248;
  UnifiedVectorFormat local_200;
  idx_t local_1b8;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b0;
  LogicalType local_178;
  LogicalType local_160;
  UnifiedVectorFormat local_148;
  Vector local_100;
  Vector local_98;
  
  pBVar16 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  iVar15 = ::std::__cxx11::string::compare
                     ((char *)&(pBVar16->function).super_BaseScalarFunction.super_SimpleFunction.
                               super_Function.name);
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,(ulong)(iVar15 == 0));
  vec_00 = vector<duckdb::Vector,_true>::operator[](&args->data,(ulong)(iVar15 != 0));
  pLVar17 = ListType::GetChildType(&vec->type);
  LogicalType::LogicalType((LogicalType *)&local_98,SQLNULL);
  bVar14 = LogicalType::operator==(pLVar17,(LogicalType *)&local_98);
  if (bVar14) {
    pLVar17 = ListType::GetChildType(&vec_00->type);
    LogicalType::LogicalType((LogicalType *)&local_100,SQLNULL);
    bVar14 = LogicalType::operator==(pLVar17,(LogicalType *)&local_100);
    LogicalType::~LogicalType((LogicalType *)&local_100);
    LogicalType::~LogicalType((LogicalType *)&local_98);
    if (bVar14) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      *result->data = '\x01';
      return;
    }
  }
  else {
    LogicalType::~LogicalType((LogicalType *)&local_98);
  }
  iVar18 = ListVector::GetListSize(vec);
  iVar19 = ListVector::GetListSize(vec_00);
  this_00 = ListVector::GetEntry(vec);
  this_01 = ListVector::GetEntry(vec_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_248);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_290);
  Vector::ToUnifiedFormat(this_00,iVar18,&local_248);
  Vector::ToUnifiedFormat(this_01,iVar19,&local_290);
  LogicalType::LogicalType(&local_160,BLOB);
  Vector::Vector(&local_98,&local_160,iVar18);
  LogicalType::~LogicalType(&local_160);
  LogicalType::LogicalType(&local_178,BLOB);
  Vector::Vector(&local_100,&local_178,iVar19);
  LogicalType::~LogicalType(&local_178);
  CreateSortKeyHelpers::CreateSortKey(this_00,iVar18,(OrderModifiers)0x302,&local_98);
  CreateSortKeyHelpers::CreateSortKey(this_01,iVar19,(OrderModifiers)0x302,&local_100);
  local_1b0._M_buckets = &local_1b0._M_single_bucket;
  local_1b0._M_bucket_count = 1;
  local_1b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b0._M_element_count = 0;
  local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1b0._M_rehash_policy._M_next_resize = 0;
  local_1b0._M_single_bucket = (__node_base_ptr)0x0;
  VVar1 = vec->vector_type;
  VVar2 = vec_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar4 = result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      uVar34 = *(ulong *)((long)vec_00->data + 8);
      dVar26 = '\x01';
      if (uVar34 != 0) {
        uVar27 = *(ulong *)vec->data;
        uVar33 = *(ulong *)vec_00->data;
        uVar31 = *(ulong *)((long)vec->data + 8);
        ::std::
        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&local_1b0);
        if (uVar27 < uVar31 + uVar27) {
          do {
            uVar30 = uVar27;
            if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
              uVar30 = (ulong)(local_248.sel)->sel_vector[uVar27];
            }
            if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) {
              local_200.sel = (SelectionVector *)&local_1b0;
              ::std::
              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&local_1b0,local_98.data + uVar30 * 0x10,&local_200);
            }
            uVar27 = uVar27 + 1;
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
        }
        if (uVar33 < uVar34 + uVar33) {
          do {
            uVar27 = uVar33;
            if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
              uVar27 = (ulong)(local_290.sel)->sel_vector[uVar33];
            }
            if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) &&
               (iVar20 = ::std::
                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(&local_1b0,(key_type *)(local_100.data + uVar27 * 0x10)),
               iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur == (__node_type *)0x0
               )) {
              dVar26 = '\0';
              goto LAB_01a75df1;
            }
            uVar33 = uVar33 + 1;
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
        }
        dVar26 = '\x01';
      }
LAB_01a75df1:
      *pdVar4 = dVar26;
      goto LAB_01a75df3;
    }
  }
  else {
    iVar18 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      puVar5 = (ulong *)vec_00->data;
      puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = vec->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vec->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar18 != 0) {
            uVar34 = *puVar5;
            uVar27 = puVar5[1];
            iVar19 = 0;
            do {
              dVar26 = '\x01';
              if (uVar27 != 0) {
                uVar33 = *(ulong *)(pdVar4 + iVar19 * 0x10);
                lVar28 = *(long *)(pdVar4 + iVar19 * 0x10 + 8);
                ::std::
                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::clear(&local_1b0);
                if (uVar33 < lVar28 + uVar33) {
                  do {
                    uVar31 = uVar33;
                    if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                      uVar31 = (ulong)(local_248.sel)->sel_vector[uVar33];
                    }
                    if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         == (unsigned_long *)0x0) ||
                       ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         [uVar31 >> 6] >> (uVar31 & 0x3f) & 1) != 0)) {
                      local_200.sel = (SelectionVector *)&local_1b0;
                      ::std::
                      _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      ::
                      _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                  *)&local_1b0,local_98.data + uVar31 * 0x10,&local_200);
                    }
                    uVar33 = uVar33 + 1;
                    lVar28 = lVar28 + -1;
                  } while (lVar28 != 0);
                }
                uVar33 = uVar27;
                uVar31 = uVar34;
                if (uVar34 < uVar34 + uVar27) {
                  do {
                    uVar30 = uVar31;
                    if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                      uVar30 = (ulong)(local_290.sel)->sel_vector[uVar31];
                    }
                    if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask == (unsigned_long *)0x0) ||
                        ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) &&
                       (iVar20 = ::std::
                                 _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 ::find(&local_1b0,(key_type *)(local_100.data + uVar30 * 0x10)),
                       iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                       (__node_type *)0x0)) {
                      dVar26 = '\0';
                      break;
                    }
                    uVar31 = uVar31 + 1;
                    uVar33 = uVar33 - 1;
                  } while (uVar33 != 0);
                }
              }
              pdVar6[iVar19] = dVar26;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar18);
          }
        }
        else if (0x3f < iVar18 + 0x3f) {
          local_2d0 = 0;
          uVar34 = 0;
          do {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar27 = uVar34 + 0x40;
              if (iVar18 <= uVar34 + 0x40) {
                uVar27 = iVar18;
              }
LAB_01a74f24:
              uVar31 = uVar34;
              if (uVar34 < uVar27) {
                uVar33 = *puVar5;
                uVar30 = puVar5[1];
                do {
                  dVar26 = '\x01';
                  if (uVar30 != 0) {
                    uVar31 = *(ulong *)(pdVar4 + uVar34 * 0x10);
                    lVar28 = *(long *)(pdVar4 + uVar34 * 0x10 + 8);
                    ::std::
                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::clear(&local_1b0);
                    if (uVar31 < lVar28 + uVar31) {
                      do {
                        uVar25 = uVar31;
                        if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                          uVar25 = (ulong)(local_248.sel)->sel_vector[uVar31];
                        }
                        if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask == (unsigned_long *)0x0) ||
                           ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
                          local_200.sel = (SelectionVector *)&local_1b0;
                          ::std::
                          _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          ::
                          _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                    ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_1b0,local_98.data + uVar25 * 0x10,&local_200);
                        }
                        uVar31 = uVar31 + 1;
                        lVar28 = lVar28 + -1;
                      } while (lVar28 != 0);
                    }
                    uVar31 = uVar33;
                    uVar25 = uVar30;
                    dVar26 = '\x01';
                    if (uVar33 < uVar33 + uVar30) {
                      do {
                        uVar32 = uVar31;
                        if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                          uVar32 = (ulong)(local_290.sel)->sel_vector[uVar31];
                        }
                        if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_mask == (unsigned_long *)0x0) ||
                            ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) &&
                           (iVar20 = ::std::
                                     _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                     ::find(&local_1b0,(key_type *)(local_100.data + uVar32 * 0x10))
                           , iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                             (__node_type *)0x0)) {
                          dVar26 = '\0';
                          break;
                        }
                        uVar31 = uVar31 + 1;
                        uVar25 = uVar25 - 1;
                      } while (uVar25 != 0);
                    }
                  }
                  pdVar6[uVar34] = dVar26;
                  uVar34 = uVar34 + 1;
                  uVar31 = uVar27;
                } while (uVar34 != uVar27);
              }
            }
            else {
              uVar33 = puVar3[local_2d0];
              uVar27 = uVar34 + 0x40;
              if (iVar18 <= uVar34 + 0x40) {
                uVar27 = iVar18;
              }
              uVar31 = uVar27;
              if (uVar33 != 0) {
                if (uVar33 == 0xffffffffffffffff) goto LAB_01a74f24;
                uVar31 = uVar34;
                uVar30 = uVar34;
                if (uVar34 < uVar27) {
                  do {
                    if ((uVar33 >> ((ulong)(uint)((int)uVar30 - (int)uVar34) & 0x3f) & 1) != 0) {
                      uVar31 = puVar5[1];
                      dVar26 = '\x01';
                      if (uVar31 != 0) {
                        uVar25 = *puVar5;
                        uVar32 = *(ulong *)(pdVar4 + uVar30 * 0x10);
                        lVar28 = *(long *)(pdVar4 + uVar30 * 0x10 + 8);
                        ::std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1b0);
                        if (uVar32 < uVar32 + lVar28) {
                          do {
                            uVar29 = uVar32;
                            if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                              uVar29 = (ulong)(local_248.sel)->sel_vector[uVar32];
                            }
                            if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask == (unsigned_long *)0x0) ||
                               ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0)) {
                              local_200.sel = (SelectionVector *)&local_1b0;
                              ::std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1b0,local_98.data + uVar29 * 0x10,&local_200);
                            }
                            uVar32 = uVar32 + 1;
                            lVar28 = lVar28 + -1;
                          } while (lVar28 != 0);
                        }
                        dVar26 = '\x01';
                        if (uVar25 < uVar25 + uVar31) {
                          do {
                            uVar32 = uVar25;
                            if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                              uVar32 = (ulong)(local_290.sel)->sel_vector[uVar25];
                            }
                            if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask == (unsigned_long *)0x0) ||
                                ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) &&
                               (iVar20 = ::std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1b0,
                                                (key_type *)(local_100.data + uVar32 * 0x10)),
                               iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) {
                              dVar26 = '\0';
                              break;
                            }
                            uVar25 = uVar25 + 1;
                            uVar31 = uVar31 - 1;
                          } while (uVar31 != 0);
                        }
                      }
                      pdVar6[uVar30] = dVar26;
                    }
                    uVar30 = uVar30 + 1;
                    uVar31 = uVar27;
                  } while (uVar30 != uVar27);
                }
              }
            }
            local_2d0 = local_2d0 + 1;
            uVar34 = uVar31;
          } while (local_2d0 != iVar18 + 0x3f >> 6);
        }
        goto LAB_01a75df3;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar4 = vec->data;
          pdVar6 = vec_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar9 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vec);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vec->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vec_00);
          this_02 = &result->validity;
          ValidityMask::Combine(this_02,&vec_00->validity,iVar18);
          if ((this_02->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar18 != 0) {
              iVar19 = 0;
              do {
                lVar35 = iVar19 * 0x10;
                lVar28 = *(long *)(pdVar6 + lVar35 + 8);
                dVar26 = '\x01';
                if (lVar28 != 0) {
                  uVar34 = *(ulong *)(pdVar6 + lVar35);
                  uVar27 = *(ulong *)(pdVar4 + lVar35);
                  lVar35 = *(long *)(pdVar4 + lVar35 + 8);
                  ::std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1b0);
                  if (uVar27 < lVar35 + uVar27) {
                    do {
                      uVar33 = uVar27;
                      if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                        uVar33 = (ulong)(local_248.sel)->sel_vector[uVar27];
                      }
                      if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask == (unsigned_long *)0x0) ||
                         ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) != 0)) {
                        local_200.sel = (SelectionVector *)&local_1b0;
                        ::std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1b0,local_98.data + uVar33 * 0x10,&local_200);
                      }
                      uVar27 = uVar27 + 1;
                      lVar35 = lVar35 + -1;
                    } while (lVar35 != 0);
                  }
                  if (uVar34 < lVar28 + uVar34) {
                    do {
                      uVar27 = uVar34;
                      if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                        uVar27 = (ulong)(local_290.sel)->sel_vector[uVar34];
                      }
                      if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask == (unsigned_long *)0x0) ||
                          ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) &&
                         (iVar20 = ::std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_1b0,(key_type *)(local_100.data + uVar27 * 0x10)),
                         iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                         (__node_type *)0x0)) {
                        dVar26 = '\0';
                        goto LAB_01a76130;
                      }
                      uVar34 = uVar34 + 1;
                      lVar28 = lVar28 + -1;
                    } while (lVar28 != 0);
                  }
                  dVar26 = '\x01';
                }
LAB_01a76130:
                pdVar9[iVar19] = dVar26;
                iVar19 = iVar19 + 1;
              } while (iVar19 != iVar18);
            }
          }
          else if (0x3f < iVar18 + 0x3f) {
            local_2d8 = 0;
            uVar34 = 0;
            do {
              puVar3 = (this_02->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar27 = uVar34 + 0x40;
                if (iVar18 <= uVar34 + 0x40) {
                  uVar27 = iVar18;
                }
LAB_01a75a18:
                uVar31 = uVar34;
                if (uVar34 < uVar27) {
                  do {
                    lVar35 = uVar34 * 0x10;
                    lVar28 = *(long *)(pdVar6 + lVar35 + 8);
                    dVar26 = '\x01';
                    if (lVar28 != 0) {
                      uVar33 = *(ulong *)(pdVar6 + lVar35);
                      uVar31 = *(ulong *)(pdVar4 + lVar35);
                      lVar35 = *(long *)(pdVar4 + lVar35 + 8);
                      ::std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_1b0);
                      if (uVar31 < uVar31 + lVar35) {
                        do {
                          uVar30 = uVar31;
                          if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                            uVar30 = (ulong)(local_248.sel)->sel_vector[uVar31];
                          }
                          if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask == (unsigned_long *)0x0) ||
                             ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask[uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) {
                            local_200.sel = (SelectionVector *)&local_1b0;
                            ::std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)&local_1b0,local_98.data + uVar30 * 0x10,&local_200);
                          }
                          uVar31 = uVar31 + 1;
                          lVar35 = lVar35 + -1;
                        } while (lVar35 != 0);
                      }
                      if (uVar33 < uVar33 + lVar28) {
                        do {
                          uVar31 = uVar33;
                          if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                            uVar31 = (ulong)(local_290.sel)->sel_vector[uVar33];
                          }
                          if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                                validity_mask == (unsigned_long *)0x0) ||
                              ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                                validity_mask[uVar31 >> 6] >> (uVar31 & 0x3f) & 1) != 0)) &&
                             (iVar20 = ::std::
                                       _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                       ::find(&local_1b0,
                                              (key_type *)(local_100.data + uVar31 * 0x10)),
                             iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                             (__node_type *)0x0)) {
                            dVar26 = '\0';
                            goto LAB_01a75b35;
                          }
                          uVar33 = uVar33 + 1;
                          lVar28 = lVar28 + -1;
                        } while (lVar28 != 0);
                      }
                      dVar26 = '\x01';
                    }
LAB_01a75b35:
                    pdVar9[uVar34] = dVar26;
                    uVar34 = uVar34 + 1;
                    uVar31 = uVar27;
                  } while (uVar34 != uVar27);
                }
              }
              else {
                uVar33 = puVar3[local_2d8];
                uVar27 = uVar34 + 0x40;
                if (iVar18 <= uVar34 + 0x40) {
                  uVar27 = iVar18;
                }
                uVar31 = uVar27;
                if (uVar33 != 0) {
                  if (uVar33 == 0xffffffffffffffff) goto LAB_01a75a18;
                  uVar30 = uVar34;
                  uVar31 = uVar34;
                  if (uVar34 < uVar27) {
                    do {
                      if ((uVar33 >> ((ulong)(uint)((int)uVar30 - (int)uVar34) & 0x3f) & 1) != 0) {
                        lVar35 = uVar30 * 0x10;
                        lVar28 = *(long *)(pdVar6 + lVar35 + 8);
                        dVar26 = '\x01';
                        if (lVar28 != 0) {
                          uVar31 = *(ulong *)(pdVar6 + lVar35);
                          uVar25 = *(ulong *)(pdVar4 + lVar35);
                          lVar35 = *(long *)(pdVar4 + lVar35 + 8);
                          ::std::
                          _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          ::clear(&local_1b0);
                          if (uVar25 < uVar25 + lVar35) {
                            do {
                              uVar32 = uVar25;
                              if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                                uVar32 = (ulong)(local_248.sel)->sel_vector[uVar25];
                              }
                              if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                                   validity_mask == (unsigned_long *)0x0) ||
                                 ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                                   validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) {
                                local_200.sel = (SelectionVector *)&local_1b0;
                                ::std::
                                _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                ::
                                _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                          ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                            *)&local_1b0,local_98.data + uVar32 * 0x10,&local_200);
                              }
                              uVar25 = uVar25 + 1;
                              lVar35 = lVar35 + -1;
                            } while (lVar35 != 0);
                          }
                          dVar26 = '\x01';
                          if (uVar31 < uVar31 + lVar28) {
                            do {
                              uVar25 = uVar31;
                              if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                                uVar25 = (ulong)(local_290.sel)->sel_vector[uVar31];
                              }
                              if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                                    validity_mask == (unsigned_long *)0x0) ||
                                  ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                                    validity_mask[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) &&
                                 (iVar20 = ::std::
                                           _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                           ::find(&local_1b0,
                                                  (key_type *)(local_100.data + uVar25 * 0x10)),
                                 iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                                 (__node_type *)0x0)) {
                                dVar26 = '\0';
                                break;
                              }
                              uVar31 = uVar31 + 1;
                              lVar28 = lVar28 + -1;
                            } while (lVar28 != 0);
                          }
                        }
                        pdVar9[uVar30] = dVar26;
                      }
                      uVar30 = uVar30 + 1;
                      uVar31 = uVar27;
                    } while (uVar30 != uVar27);
                  }
                }
              }
              local_2d8 = local_2d8 + 1;
              uVar34 = uVar31;
            } while (local_2d8 != iVar18 + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_148);
          Vector::ToUnifiedFormat(vec,iVar18,&local_200);
          Vector::ToUnifiedFormat(vec_00,iVar18,&local_148);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pSVar13 = local_200.sel;
          pdVar4 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar18 != 0) {
              pp_Var7 = (__buckets_ptr)pSVar13->sel_vector;
              psVar8 = (local_148.sel)->sel_vector;
              iVar19 = 0;
              do {
                iVar21 = iVar19;
                if (pp_Var7 != (__buckets_ptr)0x0) {
                  iVar21 = (idx_t)*(uint *)((long)pp_Var7 + iVar19 * 4);
                }
                iVar24 = iVar19;
                if (psVar8 != (sel_t *)0x0) {
                  iVar24 = (idx_t)psVar8[iVar19];
                }
                lVar28 = *(long *)(local_148.data + iVar24 * 0x10 + 8);
                dVar26 = '\x01';
                if (lVar28 != 0) {
                  uVar34 = *(ulong *)(local_200.data + iVar21 * 0x10);
                  lVar35 = *(long *)(local_200.data + iVar21 * 0x10 + 8);
                  uVar27 = *(ulong *)(local_148.data + iVar24 * 0x10);
                  ::std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1b0);
                  if (uVar34 < lVar35 + uVar34) {
                    do {
                      uVar33 = uVar34;
                      if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                        uVar33 = (ulong)(local_248.sel)->sel_vector[uVar34];
                      }
                      if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask == (unsigned_long *)0x0) ||
                         ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) != 0)) {
                        local_2a8 = &local_1b0;
                        ::std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1b0,local_98.data + uVar33 * 0x10,&local_2a8);
                      }
                      uVar34 = uVar34 + 1;
                      lVar35 = lVar35 + -1;
                    } while (lVar35 != 0);
                  }
                  if (uVar27 < uVar27 + lVar28) {
                    do {
                      uVar34 = uVar27;
                      if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                        uVar34 = (ulong)(local_290.sel)->sel_vector[uVar27];
                      }
                      if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask == (unsigned_long *)0x0) ||
                          ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0)) &&
                         (iVar20 = ::std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_1b0,(key_type *)(local_100.data + uVar34 * 0x10)),
                         iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                         (__node_type *)0x0)) {
                        dVar26 = '\0';
                        goto LAB_01a752ba;
                      }
                      uVar27 = uVar27 + 1;
                      lVar28 = lVar28 + -1;
                    } while (lVar28 != 0);
                  }
                  dVar26 = '\x01';
                }
LAB_01a752ba:
                pdVar4[iVar19] = dVar26;
                iVar19 = iVar19 + 1;
              } while (iVar19 != iVar18);
            }
          }
          else if (iVar18 != 0) {
            pp_Var7 = (__buckets_ptr)pSVar13->sel_vector;
            psVar8 = (local_148.sel)->sel_vector;
            uVar34 = 0;
            do {
              uVar27 = uVar34;
              if (pp_Var7 != (__buckets_ptr)0x0) {
                uVar27 = (ulong)*(uint *)((long)pp_Var7 + uVar34 * 4);
              }
              uVar33 = uVar34;
              if (psVar8 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar8[uVar34];
              }
              if (((local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) &&
                 ((local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) != 0)))) {
                lVar28 = *(long *)(local_148.data + uVar33 * 0x10 + 8);
                dVar26 = '\x01';
                if (lVar28 != 0) {
                  uVar33 = *(ulong *)(local_148.data + uVar33 * 0x10);
                  uVar31 = *(ulong *)(local_200.data + uVar27 * 0x10);
                  lVar35 = *(long *)(local_200.data + uVar27 * 0x10 + 8);
                  ::std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1b0);
                  if (uVar31 < lVar35 + uVar31) {
                    do {
                      uVar27 = uVar31;
                      if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                        uVar27 = (ulong)(local_248.sel)->sel_vector[uVar31];
                      }
                      if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask == (unsigned_long *)0x0) ||
                         ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask[uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) {
                        local_2a8 = &local_1b0;
                        ::std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1b0,local_98.data + uVar27 * 0x10,&local_2a8);
                      }
                      uVar31 = uVar31 + 1;
                      lVar35 = lVar35 + -1;
                    } while (lVar35 != 0);
                  }
                  if (uVar33 < uVar33 + lVar28) {
                    do {
                      uVar27 = uVar33;
                      if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                        uVar27 = (ulong)(local_290.sel)->sel_vector[uVar33];
                      }
                      if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask == (unsigned_long *)0x0) ||
                          ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) &&
                         (iVar20 = ::std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_1b0,(key_type *)(local_100.data + uVar27 * 0x10)),
                         iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                         (__node_type *)0x0)) {
                        dVar26 = '\0';
                        goto LAB_01a75d85;
                      }
                      uVar33 = uVar33 + 1;
                      lVar28 = lVar28 + -1;
                    } while (lVar28 != 0);
                  }
                  dVar26 = '\x01';
                }
LAB_01a75d85:
                pdVar4[uVar34] = dVar26;
              }
              else {
                _Var23._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var23._M_head_impl == (unsigned_long *)0x0) {
                  local_1b8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_2a8,&local_1b8);
                  p_Var12 = p_Stack_2a0;
                  p_Var11 = local_2a8;
                  local_2a8 = (_Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)0x0;
                  p_Stack_2a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)p_Var11;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var12;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2a0);
                  }
                  pTVar22 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var23._M_head_impl =
                       (pTVar22->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var23._M_head_impl;
                }
                bVar10 = (byte)uVar34 & 0x3f;
                _Var23._M_head_impl[uVar34 >> 6] =
                     _Var23._M_head_impl[uVar34 >> 6] &
                     (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != iVar18);
          }
          if (local_148.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_200.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_200.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        goto LAB_01a75df3;
      }
      puVar5 = (ulong *)vec->data;
      puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = vec_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar18 != 0) {
            uVar34 = *puVar5;
            iVar19 = 0;
            do {
              lVar28 = *(long *)(pdVar4 + iVar19 * 0x10 + 8);
              dVar26 = '\x01';
              if (lVar28 != 0) {
                uVar27 = *(ulong *)(pdVar4 + iVar19 * 0x10);
                uVar33 = puVar5[1];
                ::std::
                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::clear(&local_1b0);
                uVar31 = uVar34;
                if (uVar34 < uVar34 + uVar33) {
                  do {
                    uVar30 = uVar31;
                    if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                      uVar30 = (ulong)(local_248.sel)->sel_vector[uVar31];
                    }
                    if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         == (unsigned_long *)0x0) ||
                       ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) {
                      local_200.sel = (SelectionVector *)&local_1b0;
                      ::std::
                      _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      ::
                      _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                  *)&local_1b0,local_98.data + uVar30 * 0x10,&local_200);
                    }
                    uVar31 = uVar31 + 1;
                    uVar33 = uVar33 - 1;
                  } while (uVar33 != 0);
                }
                if (uVar27 < uVar27 + lVar28) {
                  do {
                    uVar33 = uVar27;
                    if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                      uVar33 = (ulong)(local_290.sel)->sel_vector[uVar27];
                    }
                    if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask == (unsigned_long *)0x0) ||
                        ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) != 0)) &&
                       (iVar20 = ::std::
                                 _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 ::find(&local_1b0,(key_type *)(local_100.data + uVar33 * 0x10)),
                       iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                       (__node_type *)0x0)) {
                      dVar26 = '\0';
                      goto LAB_01a76003;
                    }
                    uVar27 = uVar27 + 1;
                    lVar28 = lVar28 + -1;
                  } while (lVar28 != 0);
                }
                dVar26 = '\x01';
              }
LAB_01a76003:
              pdVar6[iVar19] = dVar26;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar18);
          }
        }
        else if (0x3f < iVar18 + 0x3f) {
          local_2d0 = 0;
          uVar34 = 0;
          do {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar27 = uVar34 + 0x40;
              if (iVar18 <= uVar34 + 0x40) {
                uVar27 = iVar18;
              }
LAB_01a7550d:
              uVar31 = uVar34;
              if (uVar34 < uVar27) {
                uVar33 = *puVar5;
                do {
                  lVar28 = *(long *)(pdVar4 + uVar34 * 0x10 + 8);
                  dVar26 = '\x01';
                  if (lVar28 != 0) {
                    uVar31 = *(ulong *)(pdVar4 + uVar34 * 0x10);
                    uVar30 = puVar5[1];
                    ::std::
                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::clear(&local_1b0);
                    uVar25 = uVar33;
                    if (uVar33 < uVar30 + uVar33) {
                      do {
                        uVar32 = uVar25;
                        if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                          uVar32 = (ulong)(local_248.sel)->sel_vector[uVar25];
                        }
                        if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask == (unsigned_long *)0x0) ||
                           ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) {
                          local_200.sel = (SelectionVector *)&local_1b0;
                          ::std::
                          _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          ::
                          _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                    ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_1b0,local_98.data + uVar32 * 0x10,&local_200);
                        }
                        uVar25 = uVar25 + 1;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    if (uVar31 < lVar28 + uVar31) {
                      do {
                        uVar30 = uVar31;
                        if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                          uVar30 = (ulong)(local_290.sel)->sel_vector[uVar31];
                        }
                        if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_mask == (unsigned_long *)0x0) ||
                            ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_mask[uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) &&
                           (iVar20 = ::std::
                                     _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                     ::find(&local_1b0,(key_type *)(local_100.data + uVar30 * 0x10))
                           , iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                             (__node_type *)0x0)) {
                          dVar26 = '\0';
                          goto LAB_01a75633;
                        }
                        uVar31 = uVar31 + 1;
                        lVar28 = lVar28 + -1;
                      } while (lVar28 != 0);
                    }
                    dVar26 = '\x01';
                  }
LAB_01a75633:
                  pdVar6[uVar34] = dVar26;
                  uVar34 = uVar34 + 1;
                  uVar31 = uVar27;
                } while (uVar34 != uVar27);
              }
            }
            else {
              uVar33 = puVar3[local_2d0];
              uVar27 = uVar34 + 0x40;
              if (iVar18 <= uVar34 + 0x40) {
                uVar27 = iVar18;
              }
              uVar31 = uVar27;
              if (uVar33 != 0) {
                if (uVar33 == 0xffffffffffffffff) goto LAB_01a7550d;
                uVar31 = uVar34;
                uVar30 = uVar34;
                if (uVar34 < uVar27) {
                  do {
                    if ((uVar33 >> ((ulong)(uint)((int)uVar30 - (int)uVar34) & 0x3f) & 1) != 0) {
                      lVar28 = *(long *)(pdVar4 + uVar30 * 0x10 + 8);
                      dVar26 = '\x01';
                      if (lVar28 != 0) {
                        uVar31 = *(ulong *)(pdVar4 + uVar30 * 0x10);
                        uVar25 = *puVar5;
                        uVar32 = puVar5[1];
                        ::std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1b0);
                        if (uVar25 < uVar25 + uVar32) {
                          do {
                            uVar29 = uVar25;
                            if ((local_248.sel)->sel_vector != (sel_t *)0x0) {
                              uVar29 = (ulong)(local_248.sel)->sel_vector[uVar25];
                            }
                            if ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask == (unsigned_long *)0x0) ||
                               ((local_248.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0)) {
                              local_200.sel = (SelectionVector *)&local_1b0;
                              ::std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1b0,local_98.data + uVar29 * 0x10,&local_200);
                            }
                            uVar25 = uVar25 + 1;
                            uVar32 = uVar32 - 1;
                          } while (uVar32 != 0);
                        }
                        if (uVar31 < lVar28 + uVar31) {
                          do {
                            uVar25 = uVar31;
                            if ((local_290.sel)->sel_vector != (sel_t *)0x0) {
                              uVar25 = (ulong)(local_290.sel)->sel_vector[uVar31];
                            }
                            if (((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask == (unsigned_long *)0x0) ||
                                ((local_290.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) &&
                               (iVar20 = ::std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1b0,
                                                (key_type *)(local_100.data + uVar25 * 0x10)),
                               iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) {
                              dVar26 = '\0';
                              goto LAB_01a754de;
                            }
                            uVar31 = uVar31 + 1;
                            lVar28 = lVar28 + -1;
                          } while (lVar28 != 0);
                        }
                        dVar26 = '\x01';
                      }
LAB_01a754de:
                      pdVar6[uVar30] = dVar26;
                    }
                    uVar30 = uVar30 + 1;
                    uVar31 = uVar27;
                  } while (uVar30 != uVar27);
                }
              }
            }
            local_2d0 = local_2d0 + 1;
            uVar34 = uVar31;
          } while (local_2d0 != iVar18 + 0x3f >> 6);
        }
        goto LAB_01a75df3;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01a75df3:
  ::std::
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1b0);
  if (local_100.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_100.type);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_290.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_290.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_248.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_248.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListHasAllFunction(DataChunk &args, ExpressionState &state, Vector &result) {

	const auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto swap = func_expr.function.name == "<@";

	auto &l_vec = args.data[swap ? 1 : 0];
	auto &r_vec = args.data[swap ? 0 : 1];

	if (ListType::GetChildType(l_vec.GetType()) == LogicalType::SQLNULL &&
	    ListType::GetChildType(r_vec.GetType()) == LogicalType::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<bool>(result)[0] = true;
		return;
	}

	const auto l_size = ListVector::GetListSize(l_vec);
	const auto r_size = ListVector::GetListSize(r_vec);

	auto &l_child = ListVector::GetEntry(l_vec);
	auto &r_child = ListVector::GetEntry(r_vec);

	// Setup unified formats for the list elements
	UnifiedVectorFormat build_format;
	UnifiedVectorFormat probe_format;

	l_child.ToUnifiedFormat(l_size, build_format);
	r_child.ToUnifiedFormat(r_size, probe_format);

	// Create the sort keys for the list elements
	Vector l_sortkey_vec(LogicalType::BLOB, l_size);
	Vector r_sortkey_vec(LogicalType::BLOB, r_size);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);

	CreateSortKeyHelpers::CreateSortKey(l_child, l_size, order_modifiers, l_sortkey_vec);
	CreateSortKeyHelpers::CreateSortKey(r_child, r_size, order_modifiers, r_sortkey_vec);

	const auto build_data = FlatVector::GetData<string_t>(l_sortkey_vec);
	const auto probe_data = FlatVector::GetData<string_t>(r_sortkey_vec);

	string_set_t set;

	BinaryExecutor::Execute<list_entry_t, list_entry_t, bool>(
	    l_vec, r_vec, result, args.size(), [&](const list_entry_t &build_list, const list_entry_t &probe_list) {
		    // Short circuit if the probe list is empty
		    if (probe_list.length == 0) {
			    return true;
		    }

		    // Reset the set
		    set.clear();

		    // Build the set
		    for (auto idx = build_list.offset; idx < build_list.offset + build_list.length; idx++) {
			    const auto entry_idx = build_format.sel->get_index(idx);
			    if (build_format.validity.RowIsValid(entry_idx)) {
				    set.insert(build_data[entry_idx]);
			    }
		    }

		    // Probe the set
		    for (auto idx = probe_list.offset; idx < probe_list.offset + probe_list.length; idx++) {
			    const auto entry_idx = probe_format.sel->get_index(idx);
			    if (probe_format.validity.RowIsValid(entry_idx) && set.find(probe_data[entry_idx]) == set.end()) {
				    return false;
			    }
		    }
		    return true;
	    });
}